

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::SingleAttribute<int>_>
::setLeafToSymbolic(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::SingleAttribute<int>_>
                    *this,int index,NodePtr *node)

{
  Exception *this_00;
  string *in_stack_ffffffffffffff78;
  undefined3 in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  uVar1 = CONCAT13(1,in_stack_ffffffffffffffb0);
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffffb4,uVar1));
  Exception::Exception(this_00,in_stack_ffffffffffffff78);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::setLeafToSymbolic(int index, const NodePtr &node)
{
    if(!B::hasAttribute) {
        throw Exception("Cannot change leaf node for nonexistent leaf");
    } 

    NodePtr &replaceNode = const_cast<NodePtr &>(leafAttributes_.get(index));
    if(replaceNode->name() != node->name()) {
        throw Exception("Symbolic name does not match the name of the schema it references");
    }

    NodePtr symbol(new NodeSymbolic);
    NodeSymbolic *ptr = static_cast<NodeSymbolic *> (symbol.get());

    ptr->setName(node->name());
    ptr->setNode(node);
    replaceNode.swap(symbol);
}